

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDEdgePtr __thiscall ON_SubDFace::EdgePtrFromEdge(ON_SubDFace *this,ON_SubDEdge *e)

{
  ON_SubDEdgePtr *pOVar1;
  uint uVar2;
  
  if ((e != (ON_SubDEdge *)0x0) && (this->m_edge_count != 0)) {
    pOVar1 = this->m_edge4;
    uVar2 = 0;
    do {
      if (uVar2 == 4) {
        pOVar1 = this->m_edgex;
      }
      if (uVar2 == 4 && this->m_edgex == (ON_SubDEdgePtr *)0x0) {
        return (ON_SubDEdgePtr)0;
      }
      if ((ON_SubDEdge *)(pOVar1->m_ptr & 0xfffffffffffffff8) == e) {
        return (ON_SubDEdgePtr)pOVar1->m_ptr;
      }
      uVar2 = uVar2 + 1;
      pOVar1 = pOVar1 + 1;
    } while (this->m_edge_count != uVar2);
  }
  return (ON_SubDEdgePtr)0;
}

Assistant:

const ON_SubDEdgePtr ON_SubDFace::EdgePtrFromEdge(
  const class ON_SubDEdge* e
) const
{
  if (nullptr != e)
  {
    const ON_SubDEdgePtr* eptr = m_edge4;
    const unsigned int face_edge_count = m_edge_count;
    for (unsigned int fei = 0; fei < face_edge_count; fei++, eptr++)
    {
      if (4 == fei)
      {
        eptr = m_edgex;
        if (nullptr == eptr)
          break;
      }
      if (e == ON_SUBD_EDGE_POINTER(eptr->m_ptr))
        return *eptr;
    }
  }

  return ON_SubDEdgePtr::Null;
}